

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

void assert_smf_is_identical(smf_t *a,smf_t *b)

{
  smf_track_t *a_00;
  smf_track_t *b_00;
  int local_1c;
  int i;
  smf_t *b_local;
  smf_t *a_local;
  
  if (a->format != b->format) {
    __assert_fail("a->format == b->format",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x246,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (a->ppqn != b->ppqn) {
    __assert_fail("a->ppqn == b->ppqn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x247,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (a->frames_per_second != b->frames_per_second) {
    __assert_fail("a->frames_per_second == b->frames_per_second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x248,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (a->resolution == b->resolution) {
    if (a->number_of_tracks == b->number_of_tracks) {
      for (local_1c = 1; local_1c <= a->number_of_tracks; local_1c = local_1c + 1) {
        a_00 = smf_get_track_by_number(a,local_1c);
        b_00 = smf_get_track_by_number(b,local_1c);
        assert_smf_track_is_identical(a_00,b_00);
      }
      return;
    }
    __assert_fail("a->number_of_tracks == b->number_of_tracks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x24a,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  __assert_fail("a->resolution == b->resolution",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                ,0x249,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
}

Assistant:

static void
assert_smf_is_identical(const smf_t *a, const smf_t *b)
{
	int i;

	assert(a->format == b->format);
	assert(a->ppqn == b->ppqn);
	assert(a->frames_per_second == b->frames_per_second);
	assert(a->resolution == b->resolution);
	assert(a->number_of_tracks == b->number_of_tracks);

	for (i = 1; i <= a->number_of_tracks; i++)
		assert_smf_track_is_identical(smf_get_track_by_number(a, i), smf_get_track_by_number(b, i));

	/* We do not need to compare tempos explicitly, as tempo is always computed from track contents. */
}